

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WebSocketProtocol.h
# Opt level: O3

bool uWS::WebSocketProtocol<true,_uWS::WebSocketContext<true,_true>_>::consumeContinuation
               (char **src,uint *length,WebSocketState<true> *wState,void *user)

{
  char cVar1;
  char cVar2;
  char cVar3;
  byte bVar4;
  bool bVar5;
  uint uVar6;
  uint uVar7;
  bool bVar8;
  uint uVar9;
  byte *pbVar10;
  ulong uVar11;
  byte *pbVar12;
  
  uVar6 = wState->remainingBytes;
  uVar7 = *length;
  if (uVar7 < uVar6) {
    pbVar12 = (byte *)*src;
    uVar9 = (uVar7 & 0xfffffffc) + 4;
    if (uVar9 != 0) {
      pbVar10 = pbVar12 + uVar9;
      do {
        *pbVar12 = *pbVar12 ^ wState->mask[0];
        pbVar12[1] = pbVar12[1] ^ wState->mask[1];
        pbVar12[2] = pbVar12[2] ^ wState->mask[2];
        pbVar12[3] = pbVar12[3] ^ wState->mask[3];
        pbVar12 = pbVar12 + 4;
      } while (pbVar12 < pbVar10);
      uVar7 = *length;
      uVar6 = wState->remainingBytes;
      pbVar12 = (byte *)*src;
    }
    wState->remainingBytes = uVar6 - uVar7;
    bVar5 = WebSocketContext<true,_true>::handleFragment
                      ((char *)pbVar12,(ulong)*length,uVar6 - uVar7,
                       (uint)(wState->state).opCode[(char)(*(byte *)&wState->state * '\x02') >> 6],
                       (bool)(*(byte *)&wState->state >> 7),wState,user);
    if (!bVar5) {
      uVar7 = *length;
      uVar6 = uVar7 & 3;
      if (uVar6 != 0) {
        cVar1 = wState->mask[1];
        cVar2 = wState->mask[2];
        cVar3 = wState->mask[3];
        *(char *)((long)wState + (0x18 - (ulong)uVar6)) = wState->mask[0];
        wState->mask[1 - uVar7 & 3] = cVar1;
        wState->mask[4 - (ulong)uVar6 ^ 2] = cVar2;
        wState->mask[(ulong)uVar6 ^ 3] = cVar3;
      }
    }
    bVar8 = false;
  }
  else {
    uVar7 = uVar6 & 0xfffffffc;
    if (uVar7 != 0) {
      pbVar10 = (byte *)*src;
      pbVar12 = pbVar10 + uVar7;
      do {
        *pbVar10 = *pbVar10 ^ wState->mask[0];
        pbVar10[1] = pbVar10[1] ^ wState->mask[1];
        pbVar10[2] = pbVar10[2] ^ wState->mask[2];
        pbVar10[3] = pbVar10[3] ^ wState->mask[3];
        pbVar10 = pbVar10 + 4;
      } while (pbVar10 < pbVar12);
      uVar6 = wState->remainingBytes;
    }
    if ((uVar6 & 3) != 0) {
      uVar11 = 0;
      do {
        (*src)[uVar11 + (long)(int)uVar7] = (*src)[uVar11 + (long)(int)uVar7] ^ wState->mask[uVar11]
        ;
        uVar11 = uVar11 + 1;
      } while ((uVar6 & 3) != uVar11);
      uVar6 = wState->remainingBytes;
    }
    bVar8 = false;
    bVar5 = WebSocketContext<true,_true>::handleFragment
                      (*src,(ulong)uVar6,0,
                       (uint)(wState->state).opCode[(char)(*(byte *)&wState->state * '\x02') >> 6],
                       (bool)(*(byte *)&wState->state >> 7),wState,user);
    if (!bVar5) {
      bVar4 = *(byte *)&wState->state;
      if ((char)bVar4 < '\0') {
        *(byte *)&wState->state = bVar4 & 0x9f | bVar4 + 0x60 & 0x60;
      }
      uVar7 = wState->remainingBytes;
      *src = *src + uVar7;
      *length = *length - uVar7;
      *(byte *)&wState->state = *(byte *)&wState->state | 1;
      bVar8 = true;
    }
  }
  return bVar8;
}

Assistant:

static inline bool consumeContinuation(char *&src, unsigned int &length, WebSocketState<isServer> *wState, void *user) {
        if (wState->remainingBytes <= length) {
            if (isServer) {
                int n = wState->remainingBytes >> 2;
                unmaskInplace(src, src + n * 4, wState->mask);
                for (int i = 0, s = wState->remainingBytes % 4; i < s; i++) {
                    src[n * 4 + i] ^= wState->mask[i];
                }
            }

            if (Impl::handleFragment(src, wState->remainingBytes, 0, wState->state.opCode[wState->state.opStack], wState->state.lastFin, wState, user)) {
                return false;
            }

            if (wState->state.lastFin) {
                wState->state.opStack--;
            }

            src += wState->remainingBytes;
            length -= wState->remainingBytes;
            wState->state.wantsHead = true;
            return true;
        } else {
            if (isServer) {
                unmaskInplace(src, src + ((length >> 2) + 1) * 4, wState->mask);
            }

            wState->remainingBytes -= length;
            if (Impl::handleFragment(src, length, wState->remainingBytes, wState->state.opCode[wState->state.opStack], wState->state.lastFin, wState, user)) {
                return false;
            }

            if (isServer && length % 4) {
                rotateMask(4 - (length % 4), wState->mask);
            }
            return false;
        }
    }